

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSimpleConfigCase.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::SimpleConfigCase::iterate(SimpleConfigCase *this)

{
  bool bVar1;
  reference ppvVar2;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_40 [2];
  TestError *e;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_20;
  void *local_18;
  EGLConfig config;
  SimpleConfigCase *this_local;
  
  config = this;
  local_20 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
             operator++(&this->m_configIter,0);
  ppvVar2 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
            operator*(&local_20);
  local_18 = *ppvVar2;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,this->m_display,local_18);
  local_40[0]._M_current =
       (void **)std::vector<void_*,_std::allocator<void_*>_>::end(&this->m_configs);
  bVar1 = __gnu_cxx::operator!=(&this->m_configIter,local_40);
  return (uint)bVar1;
}

Assistant:

SimpleConfigCase::IterateResult SimpleConfigCase::iterate (void)
{
	DE_ASSERT(m_configIter != m_configs.end());

	EGLConfig	config	= *m_configIter++;

	try
	{
		executeForConfig(m_display, config);
	}
	catch (const tcu::TestError& e)
	{
		m_testCtx.getLog() << e;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	// \note Other errors are handled by framework (resource / internal errors).

	return (m_configIter != m_configs.end()) ? CONTINUE : STOP;
}